

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license.cpp
# Opt level: O0

string * license::normalize_date(string *__return_storage_ptr__,string *sDate)

{
  _Setfill<char> _Var1;
  _Setw _Var2;
  ulong uVar3;
  invalid_argument *piVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  ostream *poVar7;
  byte local_231;
  ostringstream local_208 [8];
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  int local_44;
  ulong uStack_40;
  int chread;
  size_t i;
  uint local_30;
  uint uStack_2c;
  bool found;
  uint day;
  uint month;
  uint year;
  string *local_18;
  string *sDate_local;
  
  local_18 = sDate;
  sDate_local = __return_storage_ptr__;
  uVar3 = std::__cxx11::string::size();
  if (uVar3 < 8) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar4,"Date string too small for known formats");
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  i._7_1_ = 0;
  uStack_40 = 0;
  while( true ) {
    local_231 = 0;
    if (uStack_40 < 3) {
      local_231 = i._7_1_ ^ 0xff;
    }
    if ((local_231 & 1) == 0) goto LAB_00194247;
    uVar5 = std::__cxx11::string::c_str();
    uVar6 = std::__cxx11::string::c_str();
    local_44 = __isoc99_sscanf(uVar5,uVar6,&day,&stack0xffffffffffffffd4,&local_30);
    if (local_44 == 3) break;
    uStack_40 = uStack_40 + 1;
  }
  i._7_1_ = 1;
LAB_00194247:
  if ((i._7_1_ & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream(local_208);
    poVar7 = (ostream *)std::ostream::operator<<(local_208,day);
    poVar7 = std::operator<<(poVar7,"-");
    _Var1 = std::setfill<char>('0');
    poVar7 = std::operator<<(poVar7,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var2);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uStack_2c);
    poVar7 = std::operator<<(poVar7,"-");
    _Var1 = std::setfill<char>('0');
    poVar7 = std::operator<<(poVar7,_Var1._M_c);
    _Var2 = std::setw(2);
    poVar7 = std::operator<<(poVar7,_Var2);
    std::ostream::operator<<(poVar7,local_30);
    std::__cxx11::ostringstream::str();
    std::__cxx11::ostringstream::~ostringstream(local_208);
    return __return_storage_ptr__;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_88,"Date [",local_18);
  std::operator+(&local_68,&local_88,"] did not match a known format. try YYYY-MM-DD");
  std::invalid_argument::invalid_argument(piVar4,(string *)&local_68);
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static const string normalize_date(const std::string &sDate) {
	if (sDate.size() < 8) throw invalid_argument("Date string too small for known formats");
	unsigned int year, month, day;
	bool found = false;
	for (size_t i = 0; i < formats_n && !found; ++i) {
		const int chread = sscanf(sDate.c_str(), formats[i].c_str(), &year, &month, &day);
		if (chread == 3) {
			found = true;
			break;
		}
	}
	if (!found) throw invalid_argument("Date [" + sDate + "] did not match a known format. try YYYY-MM-DD");
	ostringstream oss;
	oss << year << "-" << setfill('0') << std::setw(2) << month << "-" << setfill('0') << std::setw(2) << day;
	return oss.str();
}